

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void minmaxFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  void *pvVar1;
  CollSeq *pColl;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  sqlite3_value *pFrom;
  
  pvVar1 = context->pFunc->pUserData;
  pFrom = *argv;
  if (pFrom->type == '\x05') {
    return;
  }
  if (1 < argc) {
    pColl = context->pColl;
    iVar3 = 0;
    uVar4 = 1;
    do {
      if (argv[uVar4]->type == '\x05') {
        return;
      }
      uVar2 = sqlite3MemCompare(argv[iVar3],argv[uVar4],pColl);
      if (-1 < (int)(uVar2 ^ -(uint)(pvVar1 != (void *)0x0))) {
        iVar3 = (int)uVar4;
      }
      uVar4 = uVar4 + 1;
    } while ((uint)argc != uVar4);
    pFrom = argv[iVar3];
  }
  sqlite3VdbeMemCopy(&context->s,pFrom);
  return;
}

Assistant:

static void minmaxFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int i;
  int mask;    /* 0 for min() or 0xffffffff for max() */
  int iBest;
  CollSeq *pColl;

  assert( argc>1 );
  mask = sqlite3_user_data(context)==0 ? 0 : -1;
  pColl = sqlite3GetFuncCollSeq(context);
  assert( pColl );
  assert( mask==-1 || mask==0 );
  iBest = 0;
  if( sqlite3_value_type(argv[0])==SQLITE_NULL ) return;
  for(i=1; i<argc; i++){
    if( sqlite3_value_type(argv[i])==SQLITE_NULL ) return;
    if( (sqlite3MemCompare(argv[iBest], argv[i], pColl)^mask)>=0 ){
      testcase( mask==0 );
      iBest = i;
    }
  }
  sqlite3_result_value(context, argv[iBest]);
}